

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O1

string_t __thiscall
duckdb::CaseConvertOperator<false>::Operation<duckdb::string_t,duckdb::string_t>
          (CaseConvertOperator<false> *this,string_t input,Vector *result)

{
  Vector *vector;
  ulong uVar1;
  idx_t len;
  char *result_data;
  char *input_data;
  undefined1 local_38 [16];
  undefined8 local_28;
  char *local_20;
  
  local_20 = input.value._0_8_;
  uVar1 = (ulong)this & 0xffffffff;
  input_data = (char *)((long)&local_28 + 4);
  if (0xc < uVar1) {
    input_data = local_20;
  }
  local_28 = this;
  vector = (Vector *)GetResultLength<false>(input_data,uVar1);
  local_38 = (undefined1  [16])StringVector::EmptyString(input.value._8_8_,vector,len);
  result_data = local_38._8_8_;
  if (local_38._0_4_ < 0xd) {
    result_data = local_38 + 4;
  }
  CaseConvert<false>(input_data,uVar1,result_data);
  uVar1 = (ulong)(uint)local_38._0_4_;
  if (uVar1 < 0xd) {
    switchD_01306cb1::default(local_38 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_38._4_4_ = *(undefined4 *)local_38._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_38;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		return UnicodeCaseConvert<IS_UPPER>(result, input_data, input_length);
	}